

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::init
          (RandomSSBOLayoutCase *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  char *pcVar2;
  BufferBlock *pBVar3;
  deUint32 dVar4;
  uint uVar5;
  deBool dVar6;
  uint extraout_EAX;
  long *plVar7;
  BufferBlock *pBVar8;
  BufferBlock *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  uint uVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  bool bVar14;
  int iVar15;
  vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_> *this_00;
  ulong uVar16;
  float fVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> layoutFlagCandidates;
  string name;
  Random rnd;
  VarType type;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  undefined1 local_e8 [32];
  int local_c8;
  uint local_c4;
  BufferBlock *local_c0;
  deRandom local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  VarType local_88;
  ulong local_68;
  int local_5c;
  ShaderInterface *local_58;
  ulong local_50;
  VarType local_48;
  
  deRandom_init(&local_b8,this->m_seed);
  uVar10 = this->m_maxBlocks;
  dVar4 = deRandom_getUint32(&local_b8);
  local_50 = 0;
  uVar5 = dVar4 / uVar10;
  uVar10 = dVar4 % uVar10;
  if (uVar10 < 0x7fffffff) {
    local_c8 = uVar10 + 1;
    local_58 = &(this->super_SSBOLayoutCase).m_interface;
    do {
      local_e8._0_8_ = local_e8 + 0x10;
      local_e8[0x14] = 'k';
      local_e8._16_4_ = 0x636f6c42;
      local_e8._8_8_ = 5;
      local_e8[0x15] = '\0';
      plVar7 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_e8,5,0,'\x01');
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar9) {
        local_98._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_98._8_8_ = plVar7[3];
        local_a8._M_allocated_capacity = (size_type)&local_98;
      }
      else {
        local_98._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_a8._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_a8._8_8_ = plVar7[1];
      *plVar7 = (long)paVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      pBVar8 = bb::ShaderInterface::allocBlock(local_58,(char *)local_a8._M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_allocated_capacity != &local_98) {
        operator_delete((void *)local_a8._M_allocated_capacity,local_98._M_allocated_capacity + 1);
      }
      if ((BufferBlock *)local_e8._0_8_ != (BufferBlock *)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,
                        CONCAT26(local_e8._22_2_,
                                 CONCAT15(local_e8[0x15],CONCAT14(local_e8[0x14],local_e8._16_4_)))
                        + 1);
      }
      uVar10 = 0;
      local_c0 = pBVar8;
      if ((0 < this->m_maxInstances) && (fVar17 = deRandom_getFloat(&local_b8), fVar17 < 0.3)) {
        iVar15 = this->m_maxInstances;
        dVar4 = deRandom_getUint32(&local_b8);
        uVar10 = dVar4 % (iVar15 + 1U);
      }
      uVar5 = this->m_maxBlockMembers;
      local_c4 = uVar10;
      dVar4 = deRandom_getUint32(&local_b8);
      local_68 = (ulong)dVar4 % (ulong)uVar5;
      uVar10 = (uint)local_68;
      if ((int)local_c4 < 1) {
        dVar6 = deRandom_getBool(&local_b8);
        if (dVar6 == 1) goto LAB_014bfe84;
      }
      else {
        bb::BufferBlock::setArraySize(local_c0,local_c4);
LAB_014bfe84:
        local_e8._0_8_ = local_e8 + 0x10;
        local_e8[0x14] = 'k';
        local_e8._16_4_ = 0x636f6c62;
        local_e8._8_8_ = 5;
        local_e8[0x15] = '\0';
        plVar7 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_e8,5,0,'\x01');
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 == paVar9) {
          local_98._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_98._8_8_ = plVar7[3];
          local_a8._M_allocated_capacity = (size_type)&local_98;
        }
        else {
          local_98._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_a8._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar7;
        }
        uVar13 = local_a8._M_allocated_capacity;
        local_a8._8_8_ = plVar7[1];
        *plVar7 = (long)paVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        psVar1 = &local_c0->m_instanceName;
        pcVar2 = (char *)(local_c0->m_instanceName)._M_string_length;
        strlen((char *)local_a8._M_allocated_capacity);
        std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,uVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_allocated_capacity != &local_98) {
          operator_delete((void *)local_a8._M_allocated_capacity,local_98._M_allocated_capacity + 1)
          ;
        }
        if ((BufferBlock *)local_e8._0_8_ != (BufferBlock *)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,
                          CONCAT26(local_e8._22_2_,
                                   CONCAT15(local_e8[0x15],CONCAT14(local_e8[0x14],local_e8._16_4_))
                                  ) + 1);
        }
        uVar10 = (uint)local_68;
      }
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (uint *)0x0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_108,(iterator)0x0,(uint *)&local_a8._M_allocated_capacity);
      if ((this->m_features & 0x100) != 0) {
        local_a8._M_allocated_capacity._0_4_ = 2;
        if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (uint *)&local_a8._M_allocated_capacity);
        }
        else {
          *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 2;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((this->m_features & 0x200) != 0) {
        local_a8._M_allocated_capacity._0_4_ = 1;
        if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (uint *)&local_a8._M_allocated_capacity);
        }
        else {
          *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 1;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((this->m_features & 0x400) != 0) {
        local_a8._M_allocated_capacity._0_4_ = 4;
        if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (uint *)&local_a8._M_allocated_capacity);
        }
        else {
          *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 4;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffff00000000;
      uVar13 = 1;
      de::Random::
      choose<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
                ((Random *)&local_b8,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)&local_a8._M_allocated_capacity,1);
      uVar12 = local_a8._M_allocated_capacity._0_4_;
      if ((this->m_features & 0x1000) != 0) {
        local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffff00000000;
        uVar13 = 1;
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  ((Random *)&local_b8,
                   (uint *)Functional::(anonymous_namespace)::RandomSSBOLayoutCase::
                           generateBlock(de::Random&,unsigned_int)::matrixCandidates,
                   generateType::precisionCandidates,(uint *)&local_a8._M_allocated_capacity,1);
        uVar12 = uVar12 | local_a8._M_allocated_capacity._0_4_;
      }
      local_c0->m_flags = uVar12;
      pBVar8 = local_c0;
      if (uVar10 < 0x7fffffff) {
        local_5c = uVar10 + 1;
        this_00 = &local_c0->m_variables;
        iVar15 = 0;
        do {
          uVar10 = this->m_features;
          Functional::(anonymous_namespace)::genName_abi_cxx11_
                    ((string *)local_e8,(_anonymous_namespace_ *)0x61,'z',(char)this->m_bufferVarNdx
                     ,(int)uVar13);
          uVar13 = 1;
          generateType(&local_48,this,(Random *)&local_b8,0,true,
                       (bool)((byte)(this->m_features >> 0xd) & 1 & (uint)local_68 == iVar15));
          bVar14 = true;
          if ((uVar10 & 0x40) != 0) {
            fVar17 = deRandom_getFloat(&local_b8);
            bVar14 = fVar17 < 0.85;
          }
          uVar10 = 0;
          bVar11 = false;
          if (bVar14 != false) {
            fVar17 = deRandom_getFloat(&local_b8);
            bVar11 = fVar17 < 0.7;
            uVar10 = 0x1000;
          }
          if ((bVar14 & bVar11) == 1) {
            fVar17 = deRandom_getFloat(&local_b8);
            uVar10 = (uint)(fVar17 < 0.7) << 0xc;
          }
          bb::BufferVar::BufferVar
                    ((BufferVar *)&local_a8,(char *)local_e8._0_8_,&local_48,
                     (uint)bVar11 << 0xb | uVar10);
          std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::
          push_back(this_00,(value_type *)&local_a8);
          glu::VarType::~VarType(&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_allocated_capacity != &local_98) {
            operator_delete((void *)local_a8._M_allocated_capacity,
                            local_98._M_allocated_capacity + 1);
          }
          this->m_bufferVarNdx = this->m_bufferVarNdx + 1;
          glu::VarType::~VarType(&local_48);
          pBVar8 = (BufferBlock *)(local_e8 + 0x10);
          if ((BufferBlock *)local_e8._0_8_ != pBVar8) {
            operator_delete((void *)local_e8._0_8_,
                            CONCAT26(local_e8._22_2_,
                                     CONCAT15(local_e8[0x15],
                                              CONCAT14(local_e8[0x14],local_e8._16_4_))) + 1);
            pBVar8 = extraout_RAX;
          }
          pBVar3 = local_c0;
          iVar15 = iVar15 + 1;
        } while (iVar15 < local_5c);
        if (((((uint)local_68 < 0x7fffffff) &&
             (pBVar8 = (BufferBlock *)
                       (local_c0->m_variables).
                       super__Vector_base<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
             *(int *)&pBVar8[-1].m_lastUnsizedArraySizes.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start == 1)) &&
            (*(int *)&pBVar8[-1].m_lastUnsizedArraySizes.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage == -1)) &&
           (uVar10 = local_c4 + (local_c4 == 0), 0 < (int)uVar10)) {
          uVar16 = 0;
          do {
            iVar15 = this->m_maxArrayLength;
            dVar4 = deRandom_getUint32(&local_b8);
            pBVar8 = (BufferBlock *)
                     (pBVar3->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(uint *)((long)&(pBVar8->m_blockName)._M_dataplus._M_p + uVar16 * 4) =
                 dVar4 % (iVar15 + 1U);
            uVar16 = uVar16 + 1;
          } while (uVar10 != uVar16);
        }
      }
      uVar5 = (uint)pBVar8;
      this->m_blockNdx = this->m_blockNdx + 1;
      if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        uVar5 = extraout_EAX;
      }
      uVar10 = (int)local_50 + 1;
      local_50 = (ulong)uVar10;
    } while ((int)uVar10 < local_c8);
  }
  return uVar5;
}

Assistant:

void RandomSSBOLayoutCase::init (void)
{
	de::Random rnd(m_seed);

	const int numBlocks = rnd.getInt(1, m_maxBlocks);

	for (int ndx = 0; ndx < numBlocks; ndx++)
		generateBlock(rnd, 0);
}